

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# XercesXPath.cpp
# Opt level: O2

bool __thiscall
xercesc_4_0::XPathScanner::scanExpression
          (XPathScanner *this,XMLCh *data,XMLSize_t currentOffset,XMLSize_t endOffset,
          ValueVectorOf<int> *tokens)

{
  XMLSize_t currentOffset_00;
  XMLStringPool *pXVar1;
  bool bVar2;
  int iVar3;
  undefined4 extraout_var;
  XMLSize_t XVar4;
  XMLCh *pXVar5;
  XPathException *pXVar6;
  XMLSize_t XVar7;
  _func_int *p_Var8;
  undefined8 uVar9;
  uint *this_00;
  XPathScanner *pXVar10;
  long lVar11;
  long lVar12;
  bool bVar13;
  XMLCh XVar14;
  bool bVar15;
  undefined8 uStackY_d0;
  int prefixHandle;
  int nameHandle;
  XMLSize_t local_88;
  XMLCh str [2];
  XMLBuffer dataBuffer;
  
  nameHandle = -1;
  prefixHandle = -1;
  this_00 = (uint *)tokens->fMemoryManager;
  dataBuffer.fIndex = 0;
  dataBuffer.fCapacity = 0x80;
  dataBuffer.fFullSize = 0;
  dataBuffer.fUsed = false;
  dataBuffer.fFullHandler = (XMLBufferFullHandler *)0x0;
  dataBuffer.fMemoryManager = (MemoryManager *)this_00;
  iVar3 = (*((XPathScanner *)this_00)->_vptr_XPathScanner[3])(this_00,0x102);
  dataBuffer.fBuffer = (XMLCh *)CONCAT44(extraout_var,iVar3);
  *dataBuffer.fBuffer = L'\0';
  local_88 = endOffset - 1;
  bVar15 = false;
LAB_00304c44:
  while( true ) {
    bVar13 = true;
    if (currentOffset == endOffset) goto LAB_003056b7;
    lVar11 = currentOffset * -2;
    pXVar5 = data + currentOffset + 1;
    while( true ) {
      XVar14 = data[currentOffset];
      if (-1 < (char)(&XMLChar1_0::fgCharCharsTable1_0)[(ushort)XVar14]) break;
      currentOffset = currentOffset + 1;
      lVar11 = lVar11 + -2;
      pXVar5 = pXVar5 + 1;
      if (endOffset == currentOffset) goto LAB_003056b7;
    }
    if (endOffset == currentOffset) goto LAB_003056b7;
    if ((ushort)XVar14 < 0x80) break;
switchD_00304cec_caseD_14:
    XVar4 = scanNCName((XPathScanner *)this_00,data,endOffset,currentOffset);
    if (XVar4 - currentOffset == 0) goto LAB_003056b4;
    if (XVar4 < endOffset) {
      XVar14 = data[XVar4];
    }
    else {
      XVar14 = L'\0';
    }
    XMLBuffer::set(&dataBuffer,(XMLCh *)((long)data - lVar11),XVar4 - currentOffset);
    pXVar10 = (XPathScanner *)this->fStringPool;
    dataBuffer.fBuffer[dataBuffer.fIndex] = L'\0';
    iVar3 = (*((XSerializable *)&pXVar10->_vptr_XPathScanner)->_vptr_XSerializable[5])();
    prefixHandle = -1;
    XVar7 = XVar4;
    if (XVar14 == L':') {
      currentOffset_00 = XVar4 + 1;
      nameHandle = iVar3;
      if (currentOffset_00 == endOffset) goto LAB_003056b4;
      if (data[currentOffset_00] == L':') {
        XVar7 = XVar4 + 2;
        bVar13 = true;
        if (XVar7 < endOffset) {
          XVar14 = data[XVar4 + 2];
        }
        else {
          XVar14 = L':';
        }
        bVar2 = false;
      }
      else {
        if (data[currentOffset_00] != L'*') {
          prefixHandle = iVar3;
          XVar7 = scanNCName(pXVar10,data,endOffset,currentOffset_00);
          if (XVar7 - currentOffset_00 != 0) {
            if (XVar7 < endOffset) {
              XVar14 = data[XVar7];
            }
            else {
              XVar14 = L'\0';
            }
            XMLBuffer::set(&dataBuffer,data + currentOffset_00,XVar7 - currentOffset_00);
            pXVar1 = this->fStringPool;
            dataBuffer.fBuffer[dataBuffer.fIndex] = L'\0';
            iVar3 = (*(pXVar1->super_XSerializable)._vptr_XSerializable[5])();
            goto LAB_00304e36;
          }
          goto LAB_003056b4;
        }
        XVar7 = XVar4 + 2;
        bVar2 = true;
        if (XVar7 < endOffset) {
          XVar14 = data[XVar4 + 2];
        }
        else {
          XVar14 = L'*';
        }
        bVar13 = false;
      }
    }
    else {
LAB_00304e36:
      bVar2 = false;
      bVar13 = false;
      nameHandle = iVar3;
    }
    for (; (currentOffset = XVar7, (char)(&XMLChar1_0::fgCharCharsTable1_0)[(ushort)XVar14] < '\0'
           && (currentOffset = endOffset, local_88 != XVar7)); XVar7 = XVar7 + 1) {
      XVar14 = data[XVar7 + 1];
    }
    if (bVar15) {
      uVar9 = 0x10;
      if ((((iVar3 == this->fAndSymbol) || (uVar9 = 0x11, iVar3 == this->fOrSymbol)) ||
          (uVar9 = 0x12, iVar3 == this->fModSymbol)) || (uVar9 = 0x13, iVar3 == this->fDivSymbol))
      goto LAB_00304e98;
      goto LAB_003056b4;
    }
    if ((bVar13 || bVar2) || XVar14 != L'(') {
      if ((bVar13) ||
         (((XVar14 == L':' && (currentOffset + 1 < endOffset)) && (data[currentOffset + 1] == L':'))
         )) {
        uVar9 = 0x21;
        if (((((iVar3 != this->fAncestorSymbol) &&
              (uVar9 = 0x22, iVar3 != this->fAncestorOrSelfSymbol)) &&
             ((((uVar9 = 0x23, iVar3 != this->fAttributeSymbol &&
                (((uVar9 = 0x24, iVar3 != this->fChildSymbol &&
                  (uVar9 = 0x25, iVar3 != this->fDescendantSymbol)) &&
                 (uVar9 = 0x26, iVar3 != this->fDescendantOrSelfSymbol)))) &&
               ((uVar9 = 0x27, iVar3 != this->fFollowingSymbol &&
                (uVar9 = 0x28, iVar3 != this->fFollowingSiblingSymbol)))) &&
              (uVar9 = 0x29, iVar3 != this->fNamespaceSymbol)))) &&
            (((uVar9 = 0x2a, iVar3 != this->fParentSymbol &&
              (uVar9 = 0x2b, iVar3 != this->fPrecedingSymbol)) &&
             ((uVar9 = 0x2c, iVar3 != this->fPrecedingSiblingSymbol &&
              (uVar9 = 0x2d, iVar3 != this->fSelfSymbol)))))) ||
           ((*this->_vptr_XPathScanner[2])(this,tokens,uVar9), bVar2)) goto LAB_003056b4;
        this_00 = (uint *)this;
        (*this->_vptr_XPathScanner[2])(this,tokens,8);
        if (!bVar13) {
          currentOffset = currentOffset + 2;
        }
        bVar15 = false;
      }
      else {
        if (bVar2) {
          (*this->_vptr_XPathScanner[2])(this,tokens,10);
        }
        else {
          (*this->_vptr_XPathScanner[2])(this,tokens,0xb);
          ValueVectorOf<int>::addElement(tokens,&prefixHandle);
        }
        bVar15 = true;
        this_00 = (uint *)tokens;
        ValueVectorOf<int>::addElement(tokens,&nameHandle);
      }
    }
    else {
      uStackY_d0 = 0xc;
      if (((iVar3 == this->fCommentSymbol) || (uStackY_d0 = 0xd, iVar3 == this->fTextSymbol)) ||
         (uStackY_d0 = 0xe, iVar3 == this->fPISymbol)) {
        p_Var8 = this->_vptr_XPathScanner[2];
LAB_00304fd5:
        (*p_Var8)(this,tokens,uStackY_d0);
      }
      else {
        p_Var8 = this->_vptr_XPathScanner[2];
        if (iVar3 == this->fNodeSymbol) {
          uStackY_d0 = 0xf;
          goto LAB_00304fd5;
        }
        (*p_Var8)(this,tokens,0x20);
        ValueVectorOf<int>::addElement(tokens,&prefixHandle);
        ValueVectorOf<int>::addElement(tokens,&nameHandle);
      }
      this_00 = (uint *)this;
      (*this->_vptr_XPathScanner[2])(this,tokens,0);
      currentOffset = currentOffset + 1;
      bVar15 = false;
    }
  }
  this_00 = &switchD_00304cec::switchdataD_00350aa0;
  switch(fASCIICharMap[(ushort)XVar14]) {
  case 3:
    if ((local_88 != currentOffset) && (data[currentOffset + 1] == L'=')) {
      this_00 = (uint *)this;
      (*this->_vptr_XPathScanner[2])(this,tokens,0x1b);
      goto LAB_003053d7;
    }
    goto LAB_003056b4;
  case 4:
    if (local_88 != currentOffset) {
      lVar12 = 0;
      for (; *pXVar5 != XVar14; pXVar5 = pXVar5 + 1) {
        if ((currentOffset - endOffset) + 2 == lVar12) goto LAB_003056b4;
        lVar12 = lVar12 + -1;
      }
      (*this->_vptr_XPathScanner[2])(this,tokens,0x2e);
      XMLBuffer::set(&dataBuffer,(XMLCh *)((long)data + (2 - lVar11)),-lVar12);
      pXVar1 = this->fStringPool;
      dataBuffer.fBuffer[dataBuffer.fIndex] = L'\0';
      str = (XMLCh  [2])(*(pXVar1->super_XSerializable)._vptr_XSerializable[5])();
      this_00 = (uint *)tokens;
      ValueVectorOf<int>::addElement(tokens,(int *)str);
      currentOffset = currentOffset - lVar12;
      goto LAB_00305449;
    }
    goto LAB_003056b4;
  case 5:
    if ((local_88 == currentOffset) ||
       (XVar4 = scanNCName((XPathScanner *)&switchD_00304cec::switchdataD_00350aa0,data,endOffset,
                           currentOffset + 1), XVar4 - 1 == currentOffset)) goto LAB_003056b4;
    if (XVar4 < endOffset) {
      bVar15 = data[XVar4] == L':';
    }
    else {
      bVar15 = false;
    }
    XMLBuffer::set(&dataBuffer,(XMLCh *)((long)data + (2 - lVar11)),~currentOffset + XVar4);
    pXVar10 = (XPathScanner *)this->fStringPool;
    dataBuffer.fBuffer[dataBuffer.fIndex] = L'\0';
    nameHandle = (*((XSerializable *)&pXVar10->_vptr_XPathScanner)->_vptr_XSerializable[5])();
    prefixHandle = -1;
    currentOffset = XVar4;
    if (bVar15) {
      XVar4 = XVar4 + 1;
      prefixHandle = nameHandle;
      if (XVar4 == endOffset) goto LAB_003056b4;
      currentOffset = scanNCName(pXVar10,data,endOffset,XVar4);
      if (currentOffset - XVar4 == 0) goto LAB_003056b4;
      XMLBuffer::set(&dataBuffer,data + XVar4,currentOffset - XVar4);
      pXVar1 = this->fStringPool;
      dataBuffer.fBuffer[dataBuffer.fIndex] = L'\0';
      nameHandle = (*(pXVar1->super_XSerializable)._vptr_XSerializable[5])();
    }
    (*this->_vptr_XPathScanner[2])(this,tokens,0x30);
    ValueVectorOf<int>::addElement(tokens,&prefixHandle);
    bVar15 = true;
    this_00 = (uint *)tokens;
    ValueVectorOf<int>::addElement(tokens,&nameHandle);
    goto LAB_00304c44;
  case 6:
    this_00 = (uint *)this;
    (*this->_vptr_XPathScanner[2])(this,tokens,0);
    break;
  case 7:
    this_00 = (uint *)this;
    (*this->_vptr_XPathScanner[2])(this,tokens,1);
    goto LAB_00305267;
  case 8:
    bVar15 = bVar15 == false;
    if (bVar15) {
      this_00 = (uint *)this;
      (*this->_vptr_XPathScanner[2])(this,tokens,9);
    }
    else {
      this_00 = (uint *)this;
      (*this->_vptr_XPathScanner[2])(this,tokens,0x14);
    }
    currentOffset = currentOffset + 1;
    goto LAB_00304c44;
  case 9:
    this_00 = (uint *)this;
    (*this->_vptr_XPathScanner[2])(this,tokens,0x18);
    break;
  case 10:
    this_00 = (uint *)this;
    (*this->_vptr_XPathScanner[2])(this,tokens,7);
    break;
  case 0xb:
    this_00 = (uint *)this;
    (*this->_vptr_XPathScanner[2])(this,tokens,0x19);
    break;
  case 0xc:
    if (local_88 == currentOffset) {
      bVar15 = true;
      this_00 = (uint *)this;
      (*this->_vptr_XPathScanner[2])(this,tokens,4);
      currentOffset = endOffset;
    }
    else {
      XVar14 = data[currentOffset + 1];
      if ((ulong)(ushort)XVar14 == 0x2e) {
        this_00 = (uint *)this;
        (*this->_vptr_XPathScanner[2])(this,tokens,5);
LAB_00305449:
        currentOffset = currentOffset + 2;
LAB_0030544d:
        bVar15 = true;
      }
      else {
        if ((ushort)(XVar14 + L'￐') < 10) goto switchD_00304cec_caseD_e;
        if ((XVar14 == L'|') || (XVar14 == L'/')) {
          currentOffset = currentOffset + 1;
          bVar15 = true;
          this_00 = (uint *)this;
          (*this->_vptr_XPathScanner[2])(this,tokens,4);
        }
        else {
          XVar4 = currentOffset;
          if (-1 < (char)(&XMLChar1_0::fgCharCharsTable1_0)[(ushort)XVar14]) {
            str[1] = L'\0';
            str[0] = XVar14;
            pXVar6 = (XPathException *)__cxa_allocate_exception(0x30);
            XPathException::XPathException
                      (pXVar6,
                       "/workspace/llm4binary/github/license_c_cmakelists/apache[P]xerces-c/src/xercesc/validators/schema/identity/XercesXPath.cpp"
                       ,0x37c,XPath_InvalidChar,str,(XMLCh *)0x0,(XMLCh *)0x0,(XMLCh *)0x0,
                       tokens->fMemoryManager);
            __cxa_throw(pXVar6,&XPathException::typeinfo,XMLException::~XMLException);
          }
          do {
            currentOffset = endOffset;
            if (local_88 == XVar4) goto LAB_00305696;
            XVar14 = data[XVar4 + 1];
            currentOffset = XVar4 + 1;
            XVar4 = currentOffset;
          } while ((char)(&XMLChar1_0::fgCharCharsTable1_0)[(ushort)XVar14] < '\0');
          if ((XVar14 == L'/') || (XVar14 == L'|')) {
LAB_00305696:
            bVar15 = true;
            this_00 = (uint *)this;
            (*this->_vptr_XPathScanner[2])(this,tokens,4);
          }
        }
      }
    }
    goto LAB_00304c44;
  case 0xd:
    uVar9 = 0x15;
    if (local_88 == currentOffset) {
LAB_00305325:
      bVar15 = false;
      this_00 = (uint *)this;
      (*this->_vptr_XPathScanner[2])(this,tokens,uVar9);
      currentOffset = endOffset;
    }
    else {
      if (data[currentOffset + 1] == L'/') {
        this_00 = (uint *)this;
        (*this->_vptr_XPathScanner[2])(this,tokens,0x16);
        goto LAB_003053d7;
      }
      currentOffset = currentOffset + 1;
      bVar15 = false;
      this_00 = (uint *)this;
      (*this->_vptr_XPathScanner[2])(this,tokens);
    }
    goto LAB_00304c44;
  case 0xe:
switchD_00304cec_caseD_e:
    this_00 = (uint *)this;
    (*this->_vptr_XPathScanner[2])(this,tokens,0x2f);
    bVar15 = true;
    currentOffset = scanNumber((XPathScanner *)this_00,data,endOffset,currentOffset,tokens);
    goto LAB_00304c44;
  case 0xf:
    if ((local_88 != currentOffset) && (data[currentOffset + 1] == L':')) {
      this_00 = (uint *)this;
      (*this->_vptr_XPathScanner[2])(this,tokens,8);
      goto LAB_003053d7;
    }
    goto LAB_003056b4;
  case 0x10:
    uVar9 = 0x1c;
    if (local_88 == currentOffset) goto LAB_00305325;
    if (data[currentOffset + 1] == L'=') {
      this_00 = (uint *)this;
      (*this->_vptr_XPathScanner[2])(this,tokens,0x1d);
      goto LAB_003053d7;
    }
    currentOffset = currentOffset + 1;
    bVar15 = false;
    this_00 = (uint *)this;
    (*this->_vptr_XPathScanner[2])(this,tokens,0x1c);
    goto LAB_00304c44;
  case 0x11:
    this_00 = (uint *)this;
    (*this->_vptr_XPathScanner[2])(this,tokens,0x1a);
    break;
  case 0x12:
    uVar9 = 0x1e;
    if (local_88 == currentOffset) goto LAB_00305325;
    if (data[currentOffset + 1] == L'=') {
      this_00 = (uint *)this;
      (*this->_vptr_XPathScanner[2])(this,tokens,0x1f);
LAB_003053d7:
      currentOffset = currentOffset + 2;
      goto LAB_003053db;
    }
    currentOffset = currentOffset + 1;
    bVar15 = false;
    this_00 = (uint *)this;
    (*this->_vptr_XPathScanner[2])(this,tokens,0x1e);
    goto LAB_00304c44;
  case 0x13:
    this_00 = (uint *)this;
    (*this->_vptr_XPathScanner[2])(this,tokens,6);
    break;
  case 0x14:
  case 0x17:
  case 0x19:
    goto switchD_00304cec_caseD_14;
  case 0x15:
    this_00 = (uint *)this;
    (*this->_vptr_XPathScanner[2])(this,tokens,2);
    break;
  case 0x16:
    this_00 = (uint *)this;
    (*this->_vptr_XPathScanner[2])(this,tokens,3);
LAB_00305267:
    currentOffset = currentOffset + 1;
    goto LAB_0030544d;
  case 0x18:
    this_00 = (uint *)this;
    (*this->_vptr_XPathScanner[2])(this,tokens,0x17);
    break;
  default:
    str[1] = L'\0';
    str[0] = XVar14;
    pXVar6 = (XPathException *)__cxa_allocate_exception(0x30);
    XPathException::XPathException
              (pXVar6,
               "/workspace/llm4binary/github/license_c_cmakelists/apache[P]xerces-c/src/xercesc/validators/schema/identity/XercesXPath.cpp"
               ,0x539,XPath_InvalidChar,str,(XMLCh *)0x0,(XMLCh *)0x0,(XMLCh *)0x0,
               tokens->fMemoryManager);
    __cxa_throw(pXVar6,&XPathException::typeinfo,XMLException::~XMLException);
  }
  currentOffset = currentOffset + 1;
LAB_003053db:
  bVar15 = false;
  goto LAB_00304c44;
LAB_00304e98:
  this_00 = (uint *)this;
  (*this->_vptr_XPathScanner[2])(this,tokens,uVar9);
  bVar15 = false;
  if (bVar2 || bVar13) {
LAB_003056b4:
    bVar13 = false;
LAB_003056b7:
    XMLBuffer::~XMLBuffer(&dataBuffer);
    return bVar13;
  }
  goto LAB_00304c44;
}

Assistant:

bool XPathScanner::scanExpression(const XMLCh* const data,
                                  XMLSize_t currentOffset,
                                  const XMLSize_t endOffset,
                                  ValueVectorOf<int>* const tokens) {

    bool      starIsMultiplyOperator = false;
    XMLSize_t nameOffset = 0;
    int       nameHandle = -1;
    int       prefixHandle = -1;
    XMLCh     ch;
    XMLBuffer dataBuffer(128, tokens->getMemoryManager());

    while (currentOffset != endOffset) {

        ch = data[currentOffset];

        while (XMLChar1_0::isWhitespace(ch)) {

            if (++currentOffset == endOffset) {
                break;
            }

            ch = data[currentOffset];
        }

        if (currentOffset == endOffset) {
            break;
        }
        //
        // [28] ExprToken ::= '(' | ')' | '[' | ']' | '.' | '..' | '@' | ',' | '::'
        //                  | NameTest | NodeType | Operator | FunctionName
        //                  | AxisName | Literal | Number | VariableReference
        //
        XMLByte chartype = (ch >= 0x80) ? (XMLByte)CHARTYPE_NONASCII : fASCIICharMap[ch];

        switch (chartype) {
        case CHARTYPE_OPEN_PAREN:       // '('
            addToken(tokens, XercesXPath::EXPRTOKEN_OPEN_PAREN);
            starIsMultiplyOperator = false;
            ++currentOffset;
            break;
        case CHARTYPE_CLOSE_PAREN:      // ')'
            addToken(tokens, XercesXPath::EXPRTOKEN_CLOSE_PAREN);
            starIsMultiplyOperator = true;
            ++currentOffset;
            break;
        case CHARTYPE_OPEN_BRACKET:     // '['
            addToken(tokens, XercesXPath::EXPRTOKEN_OPEN_BRACKET);
            starIsMultiplyOperator = false;
            ++currentOffset;
            break;
        case CHARTYPE_CLOSE_BRACKET:    // ']'
            addToken(tokens, XercesXPath::EXPRTOKEN_CLOSE_BRACKET);
            starIsMultiplyOperator = true;
            ++currentOffset;
            break;
                //
                // [30] Number ::= Digits ('.' Digits?)? | '.' Digits
                //                                         ^^^^^^^^^^
                //
        case CHARTYPE_PERIOD:           // '.', '..' or '.' Digits
            if (currentOffset + 1 == endOffset) {
                addToken(tokens, XercesXPath::EXPRTOKEN_PERIOD);
                starIsMultiplyOperator = true;
                currentOffset++;
                break;
            }

            ch = data[currentOffset + 1];

            if (ch == chPeriod) {            // '..'
                addToken(tokens, XercesXPath::EXPRTOKEN_DOUBLE_PERIOD);
                starIsMultiplyOperator = true;
                currentOffset += 2;
            } else if (ch >= chDigit_0 && ch <= chDigit_9) {
                addToken(tokens, XercesXPath::EXPRTOKEN_NUMBER);
                starIsMultiplyOperator = true;
                currentOffset = scanNumber(data, endOffset, currentOffset, tokens);
            } else if (ch == chForwardSlash) {
                addToken(tokens, XercesXPath::EXPRTOKEN_PERIOD);
                starIsMultiplyOperator = true;
                currentOffset++;
            } else if (ch == chPipe) { // '|'
                addToken(tokens, XercesXPath::EXPRTOKEN_PERIOD);
                starIsMultiplyOperator = true;
                currentOffset++;
            } else if (XMLChar1_0::isWhitespace(ch)) {
                do {
                    if (++currentOffset == endOffset)
                        break;

                    ch = data[currentOffset];
                } while (XMLChar1_0::isWhitespace(ch));

                if (currentOffset == endOffset || ch == chPipe || ch == chForwardSlash) {
				    addToken(tokens, XercesXPath::EXPRTOKEN_PERIOD);
                    starIsMultiplyOperator = true;
                    break;
                }
            } else {
                XMLCh str[2]= {ch, 0 };
                ThrowXMLwithMemMgr1(XPathException, XMLExcepts::XPath_InvalidChar, str, tokens->getMemoryManager());
            }

            break;
        case CHARTYPE_ATSIGN:           // '@'
            addToken(tokens, XercesXPath::EXPRTOKEN_ATSIGN);
            starIsMultiplyOperator = false;
            ++currentOffset;
            break;
        case CHARTYPE_COMMA:            // ','
            addToken(tokens, XercesXPath::EXPRTOKEN_COMMA);
            starIsMultiplyOperator = false;
            ++currentOffset;
            break;
        case CHARTYPE_COLON:            // '::'
            if (++currentOffset == endOffset) {
                return false; // REVISIT
            }
            ch = data[currentOffset];

            if (ch != chColon) {
                return false; // REVISIT
            }
            addToken(tokens, XercesXPath::EXPRTOKEN_DOUBLE_COLON);
            starIsMultiplyOperator = false;
            ++currentOffset;
            break;
        case CHARTYPE_SLASH:            // '/' and '//'
            if (++currentOffset == endOffset) {
                addToken(tokens, XercesXPath::EXPRTOKEN_OPERATOR_SLASH);
                starIsMultiplyOperator = false;
                break;
            }

            ch = data[currentOffset];

            if (ch == chForwardSlash) { // '//'
                addToken(tokens, XercesXPath::EXPRTOKEN_OPERATOR_DOUBLE_SLASH);
                starIsMultiplyOperator = false;
                ++currentOffset;
            } else {
                addToken(tokens, XercesXPath::EXPRTOKEN_OPERATOR_SLASH);
                starIsMultiplyOperator = false;
            }
            break;
        case CHARTYPE_UNION:            // '|'
            addToken(tokens, XercesXPath::EXPRTOKEN_OPERATOR_UNION);
            starIsMultiplyOperator = false;
            ++currentOffset;
            break;
        case CHARTYPE_PLUS:             // '+'
            addToken(tokens, XercesXPath::EXPRTOKEN_OPERATOR_PLUS);
            starIsMultiplyOperator = false;
            ++currentOffset;
            break;
        case CHARTYPE_MINUS:            // '-'
            addToken(tokens, XercesXPath::EXPRTOKEN_OPERATOR_MINUS);
            starIsMultiplyOperator = false;
            ++currentOffset;
            break;
        case CHARTYPE_EQUAL:            // '='
            addToken(tokens, XercesXPath::EXPRTOKEN_OPERATOR_EQUAL);
            starIsMultiplyOperator = false;
            ++currentOffset;
            break;
        case CHARTYPE_EXCLAMATION:      // '!='
            if (++currentOffset == endOffset) {
                return false; // REVISIT
            }

            ch = data[currentOffset];

            if (ch != chEqual) {
                return false; // REVISIT
            }

            addToken(tokens, XercesXPath::EXPRTOKEN_OPERATOR_NOT_EQUAL);
            starIsMultiplyOperator = false;
            ++currentOffset;
            break;
        case CHARTYPE_LESS: // '<' and '<='
            if (++currentOffset == endOffset) {
                addToken(tokens, XercesXPath::EXPRTOKEN_OPERATOR_LESS);
                starIsMultiplyOperator = false;
                break;
            }

            ch = data[currentOffset];

            if (ch == chEqual) { // '<='
                addToken(tokens, XercesXPath::EXPRTOKEN_OPERATOR_LESS_EQUAL);
                starIsMultiplyOperator = false;
                ++currentOffset;
            } else {
                addToken(tokens, XercesXPath::EXPRTOKEN_OPERATOR_LESS);
                starIsMultiplyOperator = false;
            }
            break;
        case CHARTYPE_GREATER: // '>' and '>='
            if (++currentOffset == endOffset) {
                addToken(tokens, XercesXPath::EXPRTOKEN_OPERATOR_GREATER);
                starIsMultiplyOperator = false;
                break;
            }

            ch = data[currentOffset];

            if (ch == chEqual) { // '>='
                addToken(tokens, XercesXPath::EXPRTOKEN_OPERATOR_GREATER_EQUAL);
                starIsMultiplyOperator = false;
                ++currentOffset;
            } else {
                addToken(tokens, XercesXPath::EXPRTOKEN_OPERATOR_GREATER);
                starIsMultiplyOperator = false;
            }
            break;
        //
        // [29] Literal ::= '"' [^"]* '"' | "'" [^']* "'"
        //
        case CHARTYPE_QUOTE:            // '\"' or '\''
            {
                XMLCh qchar = ch;
                if (++currentOffset == endOffset) {
                    return false; // REVISIT
                }

                ch = data[currentOffset];

                XMLSize_t litOffset = currentOffset;
                while (ch != qchar) {
                    if (++currentOffset == endOffset) {
                        return false; // REVISIT
                    }

                    ch = data[currentOffset];
                }

                addToken(tokens, XercesXPath::EXPRTOKEN_LITERAL);
                starIsMultiplyOperator = true;

                dataBuffer.set(data + litOffset, currentOffset - litOffset);
                tokens->addElement(fStringPool->addOrFind(dataBuffer.getRawBuffer()));
                ++currentOffset;
                break;
            }
        //
        // [30] Number ::= Digits ('.' Digits?)? | '.' Digits
        // [31] Digits ::= [0-9]+
        //
        case CHARTYPE_DIGIT:
            addToken(tokens, XercesXPath::EXPRTOKEN_NUMBER);
            starIsMultiplyOperator = true;
            currentOffset = scanNumber(data, endOffset, currentOffset, tokens);
            break;
        //
        // [36] VariableReference ::= '$' QName
        //
        case CHARTYPE_DOLLAR:
            if (++currentOffset == endOffset) {
                return false; // REVISIT
            }
            nameOffset = currentOffset;
            currentOffset = scanNCName(data, endOffset, currentOffset);

            if (currentOffset == nameOffset) {
                return false; // REVISIT
            }

            if (currentOffset < endOffset) {
                ch = data[currentOffset];
            }
            else {
                ch = 0;
            }

            dataBuffer.set(data + nameOffset, currentOffset - nameOffset);
            nameHandle = fStringPool->addOrFind(dataBuffer.getRawBuffer());
            prefixHandle = -1;

            if (ch == chColon) {

                prefixHandle = nameHandle;
                if (++currentOffset == endOffset) {
                    return false; // REVISIT
                }
                nameOffset = currentOffset;
                currentOffset = scanNCName(data, endOffset, currentOffset);

                if (currentOffset == nameOffset) {
                    return false; // REVISIT
                }

                dataBuffer.set(data + nameOffset, currentOffset - nameOffset);
                nameHandle = fStringPool->addOrFind(dataBuffer.getRawBuffer());
            }
            addToken(tokens, XercesXPath::EXPRTOKEN_VARIABLE_REFERENCE);
            starIsMultiplyOperator = true;
            tokens->addElement(prefixHandle);
            tokens->addElement(nameHandle);
            break;
        //
        // [37] NameTest ::= '*' | NCName ':' '*' | QName
        // [34] MultiplyOperator ::= '*'
        //
        case CHARTYPE_STAR:             // '*'
            //
            // 3.7 Lexical Structure
            //
            //  If there is a preceding token and the preceding token is not one of @, ::, (, [, , or
            //  an Operator, then a * must be recognized as a MultiplyOperator.
            //
            // Otherwise, the token must not be recognized as a MultiplyOperator.
            //
            if (starIsMultiplyOperator) {
                addToken(tokens, XercesXPath::EXPRTOKEN_OPERATOR_MULT);
                starIsMultiplyOperator = false;
            } else {
                addToken(tokens, XercesXPath::EXPRTOKEN_NAMETEST_ANY);
                starIsMultiplyOperator = true;
            }

            ++currentOffset;
            break;
        //
        // NCName, QName and non-terminals
        //
        case CHARTYPE_NONASCII: // possibly a valid non-ascii 'Letter' (BaseChar | Ideographic)
        case CHARTYPE_LETTER:
        case CHARTYPE_UNDERSCORE:
            {
            //
            // 3.7 Lexical Structure
            //
            //  If there is a preceding token and the preceding token is not one of @, ::, (, [, , or
            //  an Operator, then an NCName must be recognized as an OperatorName.
            //
            //  If the character following an NCName (possibly after intervening ExprWhitespace) is (,
            //  then the token must be recognized as a NodeType or a FunctionName.
            //
            //  If the two characters following an NCName (possibly after intervening ExprWhitespace)
            //  are ::, then the token must be recognized as an AxisName.
            //
            //  Otherwise, the token must not be recognized as an OperatorName, a NodeType, a
            //  FunctionName, or an AxisName.
            //
            // [33] OperatorName ::= 'and' | 'or' | 'mod' | 'div'
            // [38] NodeType ::= 'comment' | 'text' | 'processing-instruction' | 'node'
            // [35] FunctionName ::= QName - NodeType
            // [6] AxisName ::= (see above)
            //
            // [37] NameTest ::= '*' | NCName ':' '*' | QName
            // [5] NCName ::= (Letter | '_') (NCNameChar)*
            // [?] NCNameChar ::= Letter | Digit | '.' | '-' | '_'  (ascii subset of 'NCNameChar')
            // [?] QName ::= (NCName ':')? NCName
            // [?] Letter ::= [A-Za-z]                              (ascii subset of 'Letter')
            // [?] Digit ::= [0-9]                                  (ascii subset of 'Digit')
            //
            nameOffset = currentOffset;
            currentOffset = scanNCName(data, endOffset, currentOffset);
            if (currentOffset == nameOffset) {
                return false; // REVISIT
			}

            if (currentOffset < endOffset) {
                ch = data[currentOffset];
            }
            else {
                ch = 0;
            }

            dataBuffer.set(data + nameOffset, currentOffset - nameOffset);
            nameHandle = fStringPool->addOrFind(dataBuffer.getRawBuffer());

            bool isNameTestNCName = false;
            bool isAxisName = false;
            prefixHandle = -1;

            if (ch == chColon) {

                if (++currentOffset == endOffset) {
                    return false; // REVISIT
                }

                ch = data[currentOffset];

                if (ch == chAsterisk) {
                    if (++currentOffset < endOffset) {
                        ch = data[currentOffset];
                    }

                    isNameTestNCName = true;
                } else if (ch == chColon) {
                    if (++currentOffset < endOffset) {
                        ch = data[currentOffset];
                    }

                    isAxisName = true;
                } else {
                    prefixHandle = nameHandle;
                    nameOffset = currentOffset;
                    currentOffset = scanNCName(data, endOffset, currentOffset);
                    if (currentOffset == nameOffset) {
                        return false; // REVISIT
                    }
                    if (currentOffset < endOffset) {
                        ch = data[currentOffset];
                    }
                    else {
                        ch = 0;
                    }

                    dataBuffer.set(data + nameOffset, currentOffset - nameOffset);
                    nameHandle = fStringPool->addOrFind(dataBuffer.getRawBuffer());
                }
            }
            //
            // [39] ExprWhitespace ::= S
            //
            while (XMLChar1_0::isWhitespace(ch)) {
                if (++currentOffset == endOffset) {
                    break;
                }
                ch = data[currentOffset];
            }

            //
            //  If there is a preceding token and the preceding token is not one of @, ::, (, [, , or
            //  an Operator, then an NCName must be recognized as an OperatorName.
            //
            if (starIsMultiplyOperator) {
                if (nameHandle == fAndSymbol) {
                    addToken(tokens, XercesXPath::EXPRTOKEN_OPERATOR_AND);
                    starIsMultiplyOperator = false;
                } else if (nameHandle == fOrSymbol) {
                    addToken(tokens, XercesXPath::EXPRTOKEN_OPERATOR_OR);
                    starIsMultiplyOperator = false;
                } else if (nameHandle == fModSymbol) {
                    addToken(tokens, XercesXPath::EXPRTOKEN_OPERATOR_MOD);
                    starIsMultiplyOperator = false;
                } else if (nameHandle == fDivSymbol) {
                    addToken(tokens, XercesXPath::EXPRTOKEN_OPERATOR_DIV);
                    starIsMultiplyOperator = false;
                } else {
                    return false; // REVISIT
                }

                if (isNameTestNCName) {
                    return false; // REVISIT - NCName:* where an OperatorName is required
                } else if (isAxisName) {
                    return false; // REVISIT - AxisName:: where an OperatorName is required
                }
                break;
            }
            //
            //  If the character following an NCName (possibly after intervening ExprWhitespace) is (,
            //  then the token must be recognized as a NodeType or a FunctionName.
            //
            if (ch == chOpenParen && !isNameTestNCName && !isAxisName) {
                if (nameHandle == fCommentSymbol) {
                    addToken(tokens, XercesXPath::EXPRTOKEN_NODETYPE_COMMENT);
                } else if (nameHandle == fTextSymbol) {
                    addToken(tokens, XercesXPath::EXPRTOKEN_NODETYPE_TEXT);
                } else if (nameHandle == fPISymbol) {
                    addToken(tokens, XercesXPath::EXPRTOKEN_NODETYPE_PI);
                } else if (nameHandle == fNodeSymbol) {
                    addToken(tokens, XercesXPath::EXPRTOKEN_NODETYPE_NODE);
                } else {
                    addToken(tokens, XercesXPath::EXPRTOKEN_FUNCTION_NAME);
                    tokens->addElement(prefixHandle);
                    tokens->addElement(nameHandle);
                }
                addToken(tokens, XercesXPath::EXPRTOKEN_OPEN_PAREN);
                starIsMultiplyOperator = false;
                ++currentOffset;
                break;
            }

            //
            //  If the two characters following an NCName (possibly after intervening ExprWhitespace)
            //  are ::, then the token must be recognized as an AxisName.
            //
            if (isAxisName ||
                (ch == chColon && currentOffset + 1 < endOffset &&
                 data[currentOffset + 1] == chColon)) {

                if (nameHandle == fAncestorSymbol) {
                    addToken(tokens, XercesXPath::EXPRTOKEN_AXISNAME_ANCESTOR);
                } else if (nameHandle == fAncestorOrSelfSymbol) {
                    addToken(tokens, XercesXPath::EXPRTOKEN_AXISNAME_ANCESTOR_OR_SELF);
                } else if (nameHandle == fAttributeSymbol) {
                    addToken(tokens, XercesXPath::EXPRTOKEN_AXISNAME_ATTRIBUTE);
                } else if (nameHandle == fChildSymbol) {
                    addToken(tokens, XercesXPath::EXPRTOKEN_AXISNAME_CHILD);
                } else if (nameHandle == fDescendantSymbol) {
                    addToken(tokens, XercesXPath::EXPRTOKEN_AXISNAME_DESCENDANT);
                } else if (nameHandle == fDescendantOrSelfSymbol) {
                    addToken(tokens, XercesXPath::EXPRTOKEN_AXISNAME_DESCENDANT_OR_SELF);
                } else if (nameHandle == fFollowingSymbol) {
                    addToken(tokens, XercesXPath::EXPRTOKEN_AXISNAME_FOLLOWING);
                } else if (nameHandle == fFollowingSiblingSymbol) {
                    addToken(tokens, XercesXPath::EXPRTOKEN_AXISNAME_FOLLOWING_SIBLING);
                } else if (nameHandle == fNamespaceSymbol) {
                    addToken(tokens, XercesXPath::EXPRTOKEN_AXISNAME_NAMESPACE);
                } else if (nameHandle == fParentSymbol) {
                    addToken(tokens, XercesXPath::EXPRTOKEN_AXISNAME_PARENT);
                } else if (nameHandle == fPrecedingSymbol) {
                    addToken(tokens, XercesXPath::EXPRTOKEN_AXISNAME_PRECEDING);
                } else if (nameHandle == fPrecedingSiblingSymbol) {
                    addToken(tokens, XercesXPath::EXPRTOKEN_AXISNAME_PRECEDING_SIBLING);
                } else if (nameHandle == fSelfSymbol) {
                    addToken(tokens, XercesXPath::EXPRTOKEN_AXISNAME_SELF);
                } else {
                    return false; // REVISIT
                }

                if (isNameTestNCName) {
                    return false; // REVISIT - "NCName:* ::" where "AxisName ::" is required
                }

                addToken(tokens, XercesXPath::EXPRTOKEN_DOUBLE_COLON);
                starIsMultiplyOperator = false;
                if (!isAxisName) {
                    currentOffset += 2;
                }
                break;
            }
            //
            //  Otherwise, the token must not be recognized as an OperatorName, a NodeType, a
            //  FunctionName, or an AxisName.
            //
            if (isNameTestNCName) {
                addToken(tokens, XercesXPath::EXPRTOKEN_NAMETEST_NAMESPACE);
                tokens->addElement(nameHandle);
            } else {
                addToken(tokens, XercesXPath::EXPRTOKEN_NAMETEST_QNAME);
                tokens->addElement(prefixHandle);
                tokens->addElement(nameHandle);
            }

            starIsMultiplyOperator = true;
            break;
            }
        default:
            {
            XMLCh str[2]= {ch, 0 };
            ThrowXMLwithMemMgr1(XPathException, XMLExcepts::XPath_InvalidChar, str, tokens->getMemoryManager());
            break;
            }
        }
    }

    return true;
}